

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::CompactReporter::testRunEnded(CompactReporter *this,TestRunStats *_testRunStats)

{
  ColourImpl *streamColour;
  
  streamColour = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  if (streamColour != (ColourImpl *)0x0) {
    printTestRunTotals((this->super_StreamingReporterBase).super_ReporterBase.m_stream,streamColour,
                       &_testRunStats->totals);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,"\n\n",2);
    std::ostream::flush();
    (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
    return;
  }
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x37d,
                "T &Catch::Detail::unique_ptr<Catch::ColourImpl>::operator*() [T = Catch::ColourImpl]"
               );
}

Assistant:

void CompactReporter::testRunEnded( TestRunStats const& _testRunStats ) {
            printTestRunTotals( m_stream, *m_colour, _testRunStats.totals );
            m_stream << "\n\n" << std::flush;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }